

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central.cpp
# Opt level: O3

void * __thiscall Central::malloc(Central *this,size_t __size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  key_type pbVar5;
  mapped_type pSVar6;
  char *__s;
  mapped_type *ppSVar7;
  key_type pbStack_38;
  
  pbVar5 = (key_type)mmap((void *)0x0,(long)spanInfo[(this->nonempty).spanClass][2],3,0x21,0,0);
  pSVar6 = (mapped_type)operator_new(0x40);
  iVar1 = (this->nonempty).spanClass;
  iVar2 = spanInfo[iVar1][1];
  iVar3 = spanInfo[iVar1][2];
  iVar4 = spanInfo[iVar1][3];
  pSVar6->allocCount = 0;
  pSVar6->nelems = iVar4;
  pSVar6->startAddr = pbVar5;
  pSVar6->size = iVar3;
  (pSVar6->bitmap).bitmap = (char *)0x0;
  __s = (char *)operator_new__((long)iVar4);
  (pSVar6->bitmap).bitmap = __s;
  memset(__s,0,(long)iVar4);
  (pSVar6->bitmap).size = iVar4;
  pSVar6->spanClass = iVar1;
  pSVar6->elemsize = iVar2;
  pbStack_38 = pbVar5;
  ppSVar7 = std::
            map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
            ::operator[]((map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
                          *)__size,&pbStack_38);
  *ppSVar7 = pSVar6;
  pSVar6->prev = pSVar6;
  pSVar6->next = pSVar6;
  return pSVar6;
}

Assistant:

Span *Central::malloc(SpanMap *spanMap) {
    // 获取一个span, 每次获取链表头部的span
    auto span = nonempty.newSpan(spanMap);  // 如果nonempty没有span, 则调用mmap分配

    return span;

    // 让这个 span 分配一个空间, 并且设置自己的状态.
//    void *addr = span->malloc();
//    if (span->allocCount == span->nelems) {  // 已经分配满了
//        nonempty.popFront();      // pop链表头部的span
//        empty.pushFront(span);   // 将span插入到首部
//    }
//    nmalloc++;
//    return addr;
}